

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall
Model::update_schoenberg_multiple_kernel
          (Model *this,vector<double,_std::allocator<double>_> *labels,
          vector<int,_std::allocator<int>_> *contextIds,int centerId,double current_lr,
          int numOfKernels,double **kernelCoefficients)

{
  double dVar1;
  double **ppdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  size_type sVar18;
  reference pvVar19;
  reference pvVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  int local_f0;
  int local_ec;
  int k_3;
  int k_2;
  int k_1;
  int i_1;
  double *totalKer;
  double *ker;
  double kernelSum;
  uint local_c0;
  int d_6;
  int d_5;
  int d_4;
  int d_3;
  int d_2;
  int k;
  int d_1;
  int d;
  int i;
  double f;
  double e_values_sum_ext;
  double e_values_sum;
  double *e_values;
  double var;
  double *z;
  double *diff;
  double e;
  double eta;
  double *temp_g;
  double *g;
  double *neule;
  double **kernelCoefficients_local;
  int numOfKernels_local;
  double current_lr_local;
  int centerId_local;
  vector<int,_std::allocator<int>_> *contextIds_local;
  vector<double,_std::allocator<double>_> *labels_local;
  Model *this_local;
  
  uVar21 = CONCAT44(0,this->dim_size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar21;
  uVar11 = SUB168(auVar3 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar12 = (undefined8 *)operator_new__(uVar11);
  *puVar12 = 0;
  memset(puVar12 + 1,0,uVar11 - 8);
  uVar21 = CONCAT44(0,this->dim_size);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar21;
  uVar11 = SUB168(auVar4 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar13 = (undefined8 *)operator_new__(uVar11);
  *puVar13 = 0;
  memset(puVar13 + 1,0,uVar11 - 8);
  uVar21 = CONCAT44(0,this->dim_size);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar21;
  uVar11 = SUB168(auVar5 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar14 = (undefined8 *)operator_new__(uVar11);
  *puVar14 = 0;
  memset(puVar14 + 1,0,uVar11 - 8);
  uVar21 = CONCAT44(0,this->dim_size);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar21;
  uVar11 = SUB168(auVar6 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar15 = (undefined8 *)operator_new__(uVar11);
  *puVar15 = 0;
  memset(puVar15 + 1,0,uVar11 - 8);
  uVar21 = CONCAT44(0,this->dim_size);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar21;
  uVar11 = SUB168(auVar7 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar16 = (undefined8 *)operator_new__(uVar11);
  *puVar16 = 0;
  memset(puVar16 + 1,0,uVar11 - 8);
  uVar21 = CONCAT44(0,this->dim_size);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar21;
  uVar11 = SUB168(auVar8 * ZEXT816(8),0);
  if (uVar21 == 0 || SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar17 = (undefined8 *)operator_new__(uVar11);
  *puVar17 = 0;
  memset(puVar17 + 1,0,uVar11 - 8);
  d_1 = 0;
  while( true ) {
    sVar18 = std::vector<int,_std::allocator<int>_>::size(contextIds);
    if (sVar18 <= (ulong)(long)d_1) break;
    for (k = 0; (uint)k < this->dim_size; k = k + 1) {
      ppdVar2 = this->emb1;
      pvVar19 = std::vector<int,_std::allocator<int>_>::operator[](contextIds,(long)d_1);
      puVar16[k] = ppdVar2[*pvVar19][k] - this->emb0[centerId][k];
    }
    e = 0.0;
    for (d_2 = 0; (uint)d_2 < this->dim_size; d_2 = d_2 + 1) {
      e = (double)puVar16[d_2] * (double)puVar16[d_2] + e;
    }
    dVar22 = 1.0 / (e + 1.0);
    e_values_sum_ext = 0.0;
    f = 0.0;
    for (d_3 = 0; d_3 < numOfKernels; d_3 = d_3 + 1) {
      dVar23 = pow(dVar22,this->kernelParams[d_3 + 1]);
      puVar17[d_3] = (*kernelCoefficients)[d_3] * dVar23;
      e_values_sum_ext = (double)puVar17[d_3] + e_values_sum_ext;
      dVar23 = (double)puVar17[d_3] * dVar22;
      f = dVar23 + dVar23 + f;
    }
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](labels,(long)d_1);
    dVar22 = *pvVar20;
    for (d_4 = 0; (uint)d_4 < this->dim_size; d_4 = d_4 + 1) {
      puVar15[d_4] = (dVar22 - e_values_sum_ext) * 2.0 * f * (double)puVar16[d_4];
    }
    for (d_5 = 0; (uint)d_5 < this->dim_size; d_5 = d_5 + 1) {
      puVar13[d_5] = -current_lr * (double)puVar15[d_5];
    }
    for (d_6 = 0; (uint)d_6 < this->dim_size; d_6 = d_6 + 1) {
      puVar12[d_6] = (double)puVar13[d_6] + (double)puVar12[d_6];
    }
    for (local_c0 = 0; local_c0 < this->dim_size; local_c0 = local_c0 + 1) {
      dVar22 = (double)puVar13[(int)local_c0];
      dVar23 = this->lambda;
      ppdVar2 = this->emb1;
      pvVar19 = std::vector<int,_std::allocator<int>_>::operator[](contextIds,(long)d_1);
      dVar1 = ppdVar2[*pvVar19][(int)local_c0];
      ppdVar2 = this->emb1;
      pvVar19 = std::vector<int,_std::allocator<int>_>::operator[](contextIds,(long)d_1);
      ppdVar2[*pvVar19][(int)local_c0] =
           -(current_lr * dVar23) * dVar1 + dVar22 + ppdVar2[*pvVar19][(int)local_c0];
    }
    d_1 = d_1 + 1;
  }
  for (kernelSum._4_4_ = 0; kernelSum._4_4_ < this->dim_size; kernelSum._4_4_ = kernelSum._4_4_ + 1)
  {
    this->emb0[centerId][(int)kernelSum._4_4_] =
         -(current_lr * this->lambda) * this->emb0[centerId][(int)kernelSum._4_4_] +
         -(double)puVar12[(int)kernelSum._4_4_] + this->emb0[centerId][(int)kernelSum._4_4_];
  }
  if (puVar12 != (undefined8 *)0x0) {
    operator_delete__(puVar12);
  }
  if (puVar13 != (undefined8 *)0x0) {
    operator_delete__(puVar13);
  }
  if (puVar14 != (undefined8 *)0x0) {
    operator_delete__(puVar14);
  }
  if (puVar16 != (undefined8 *)0x0) {
    operator_delete__(puVar16);
  }
  if (puVar15 != (undefined8 *)0x0) {
    operator_delete__(puVar15);
  }
  if (puVar17 != (undefined8 *)0x0) {
    operator_delete__(puVar17);
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)numOfKernels;
  uVar21 = SUB168(auVar9 * ZEXT816(8),0);
  if ((long)numOfKernels == 0 || SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  puVar12 = (undefined8 *)operator_new__(uVar21);
  *puVar12 = 0;
  memset(puVar12 + 1,0,uVar21 - 8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (long)numOfKernels;
  uVar21 = SUB168(auVar10 * ZEXT816(8),0);
  if ((long)numOfKernels == 0 || SUB168(auVar10 * ZEXT816(8),8) != 0) {
    uVar21 = 0xffffffffffffffff;
  }
  puVar13 = (undefined8 *)operator_new__(uVar21);
  *puVar13 = 0;
  memset(puVar13 + 1,0,uVar21 - 8);
  k_2 = 0;
  while( true ) {
    sVar18 = std::vector<int,_std::allocator<int>_>::size(contextIds);
    if (sVar18 <= (ulong)(long)k_2) break;
    ker = (double *)0x0;
    for (k_3 = 0; k_3 < numOfKernels; k_3 = k_3 + 1) {
      pvVar19 = std::vector<int,_std::allocator<int>_>::operator[](contextIds,(long)k_2);
      dVar22 = schoenberg_kernel(this,*pvVar19,centerId,this->kernelParams[k_3 + 1]);
      puVar12[k_3] = dVar22;
      ker = (double *)((*kernelCoefficients)[k_3] * (double)puVar12[k_3] + (double)ker);
    }
    for (local_ec = 0; local_ec < numOfKernels; local_ec = local_ec + 1) {
      pvVar20 = std::vector<double,_std::allocator<double>_>::operator[](labels,(long)k_2);
      puVar13[local_ec] =
           (*pvVar20 - (double)ker) * 2.0 * -(double)puVar12[local_ec] + (double)puVar13[local_ec];
    }
    k_2 = k_2 + 1;
  }
  for (local_f0 = 0; local_f0 < numOfKernels; local_f0 = local_f0 + 1) {
    (*kernelCoefficients)[local_f0] =
         -current_lr * (double)puVar13[local_f0] +
         -(current_lr * this->beta * (*kernelCoefficients)[local_f0]) +
         (*kernelCoefficients)[local_f0];
  }
  if (puVar12 != (undefined8 *)0x0) {
    operator_delete__(puVar12);
  }
  return;
}

Assistant:

void Model::update_schoenberg_multiple_kernel(vector <double> labels, vector <int> contextIds, int centerId, double current_lr, int numOfKernels, double *&kernelCoefficients) {

    /* ----------- Update embedding vectors ----------- */
    double *neule;
    double *g, *temp_g;
    double eta, e, *diff,  *z;
    double var;
    double *e_values;

    neule = new double[this->dim_size]{0};
    g = new double[this->dim_size]{0};
    temp_g = new double[this->dim_size]{0};
    z = new double[this->dim_size]{0};
    diff = new double[this->dim_size]{0};
    e_values = new double[this->dim_size]{0};
    double e_values_sum=0;
    double e_values_sum_ext=0;
    double f;

    for(int i = 0; i < contextIds.size(); i++) {

        for (int d = 0; d < this->dim_size; d++)
            diff[d] = this->emb1[contextIds[i]][d] - this->emb0[centerId][d];

        eta = 0.0;
        for (int d = 0; d < this->dim_size; d++)
            eta += diff[d]*diff[d];
        eta = 1.0 / ( 1.0 + eta ); // eta = (1 + (x-y)^2 ) ^ {-1}

        e_values_sum = 0;
        e_values_sum_ext = 0;
        for(int k=0; k < numOfKernels; k++) {
            e = pow(eta, this->kernelParams[k+1]); // ( 1 + (x-y) )^{-\alpha}

            e_values[k] = kernelCoefficients[k] * e;
            e_values_sum += e_values[k];
            e_values_sum_ext += e_values[k] * eta * ( 2.0 );
        }

        f = 2.0 * ( labels[i] - e_values_sum  ) * ( e_values_sum_ext );
        for (int d = 0; d < this->dim_size; d++)
            z[d] = f * ( diff[d] );

        for (int d = 0; d < this->dim_size; d++)
            g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

        for (int d = 0; d < this->dim_size; d++)
            neule[d] += g[d];

        for (int d = 0; d < this->dim_size; d++)
            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
    }
    for (int d = 0; d < this->dim_size; d++)
        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);


    delete[] neule;
    delete [] g;
    delete [] temp_g;
    delete [] diff;
    delete [] z;
    delete [] e_values;
    /* ------------------------------------------------ */

    /* ---------- Update kernel coefficients ---------- */
    double kernelSum;
    double *ker, *totalKer;

    ker = new double[numOfKernels]{0};
    totalKer = new double[numOfKernels]{0};

    for(int i = 0; i < contextIds.size(); i++) {
        kernelSum = 0;
        for (int k = 0; k < numOfKernels; k++) {
            ker[k] = this->schoenberg_kernel(contextIds[i], centerId, this->kernelParams[k + 1]);
            kernelSum += kernelCoefficients[k] * ker[k];
        }
        for (int k = 0; k < numOfKernels; k++)
            totalKer[k] += 2.0 * ( labels[i] - kernelSum ) * -ker[k];
    }

    for (int k = 0; k < numOfKernels; k++)
        kernelCoefficients[k] += -current_lr * totalKer[k] - current_lr * this->beta * kernelCoefficients[k];

    delete[] ker;
    /* ------------------------------------------------ */


    /* ----------- Update embedding vectors ----------- */
//    double *neule;
//    double *g, *temp_g;
//    neule = new double[this->dim_size]{0};
//    g = new double[this->dim_size]{0};
//    temp_g = new double[this->dim_size]{0};
//
//
//    for (int i = 0; i < contextIds.size(); i++) {
//
//        for (int k = 0; k < numOfKernels; k++) {
//
//            this->get_schoenberg_grad(temp_g, labels[i], this->kernelParams[k + 1], contextIds[i], centerId, current_lr);
//
//            for (int d = 0; d < this->dim_size; d++)
//                g[d] += (1.0 / numOfKernels) * temp_g[d];
//
//        }
//
//        for (int d = 0; d < this->dim_size; d++)
//            neule[d] += g[d];
//
//        for (int d = 0; d < this->dim_size; d++)
//            this->emb1[contextIds[i]][d] += g[d] - current_lr * this->lambda * (this->emb1[contextIds[i]][d]);
//    }
//    for (int d = 0; d < this->dim_size; d++)
//        this->emb0[centerId][d] += -neule[d] - current_lr * this->lambda * (this->emb0[centerId][d]);
//
//
//    delete[] neule;
//    delete[] g;
//    delete[] temp_g;
    /* ------------------------------------------------ */

}